

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_statemach_act(connectdata *conn)

{
  _Bool local_51;
  size_t local_48;
  size_t nread;
  pingpong *pp;
  smtp_conn *smtpc;
  SessionHandle *pSStack_28;
  int smtpcode;
  SessionHandle *data;
  curl_socket_t sock;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data._0_4_ = conn->sock[0];
  pSStack_28 = conn->data;
  nread = (size_t)&conn->proto;
  local_48 = 0;
  pp = (pingpong *)nread;
  _sock = conn;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE_PLAIN) {
    conn_local._4_4_ = smtp_perform_upgrade_tls(conn);
  }
  else if ((conn->proto).ftpc.pp.sendleft == 0) {
    do {
      data._4_4_ = Curl_pp_readresp((curl_socket_t)data,(pingpong *)nread,(int *)((long)&smtpc + 4),
                                    &local_48);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
      if ((*(int *)&pp[1].cache != 0x19) && (smtpc._4_4_ != 1)) {
        (pSStack_28->info).httpcode = smtpc._4_4_;
      }
      if (smtpc._4_4_ == 0) break;
      switch(*(undefined4 *)&pp[1].cache) {
      case 1:
        data._4_4_ = smtp_state_servergreet_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 2:
        data._4_4_ = smtp_state_ehlo_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 3:
        data._4_4_ = smtp_state_helo_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 4:
        data._4_4_ = smtp_state_starttls_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 6:
        data._4_4_ = smtp_state_auth_plain_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 7:
        data._4_4_ = smtp_state_auth_login_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 8:
        data._4_4_ = smtp_state_auth_login_password_resp
                               (_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 9:
        data._4_4_ = smtp_state_auth_cram_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 10:
        data._4_4_ = smtp_state_auth_digest_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0xb:
        data._4_4_ = smtp_state_auth_digest_resp_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x11:
        data._4_4_ = smtp_state_auth_xoauth2_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x12:
        data._4_4_ = smtp_state_auth_cancel_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x13:
        data._4_4_ = smtp_state_auth_final_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x14:
        data._4_4_ = smtp_state_command_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x15:
        data._4_4_ = smtp_state_mail_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x16:
        data._4_4_ = smtp_state_rcpt_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x17:
        data._4_4_ = smtp_state_data_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x18:
        data._4_4_ = smtp_state_postdata_resp(_sock,smtpc._4_4_,*(smtpstate *)&pp[1].cache);
        break;
      case 0x19:
      default:
        state(_sock,SMTP_STOP);
      }
      local_51 = false;
      if ((data._4_4_ == CURLE_OK) && (local_51 = false, *(int *)&pp[1].cache != 0)) {
        local_51 = Curl_pp_moredata((pingpong *)nread);
      }
    } while (local_51 != false);
    conn_local._4_4_ = data._4_4_;
  }
  else {
    conn_local._4_4_ = Curl_pp_flushsend((pingpong *)nread);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct SessionHandle *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_PLAIN:
      result = smtp_state_auth_plain_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN:
      result = smtp_state_auth_login_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN_PASSWD:
      result = smtp_state_auth_login_password_resp(conn, smtpcode,
                                                   smtpc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case SMTP_AUTH_CRAMMD5:
      result = smtp_state_auth_cram_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5:
      result = smtp_state_auth_digest_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5_RESP:
      result = smtp_state_auth_digest_resp_resp(conn, smtpcode, smtpc->state);
      break;
#endif

#ifdef USE_NTLM
    case SMTP_AUTH_NTLM:
      result = smtp_state_auth_ntlm_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_NTLM_TYPE2MSG:
      result = smtp_state_auth_ntlm_type2msg_resp(conn, smtpcode,
                                                  smtpc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case SMTP_AUTH_GSSAPI:
      result = smtp_state_auth_gssapi_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_TOKEN:
      result = smtp_state_auth_gssapi_token_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_NO_DATA:
      result = smtp_state_auth_gssapi_no_data_resp(conn, smtpcode,
                                                   smtpc->state);
      break;
#endif

    case SMTP_AUTH_XOAUTH2:
      result = smtp_state_auth_xoauth2_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_CANCEL:
      result = smtp_state_auth_cancel_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_FINAL:
      result = smtp_state_auth_final_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}